

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_sf2.cpp
# Opt level: O3

void __thiscall SFFile::~SFFile(SFFile *this)

{
  void *pvVar1;
  int iVar2;
  SFSample *pSVar3;
  long lVar4;
  long lVar5;
  
  (this->super_FontFile)._vptr_FontFile = (_func_int **)&PTR__SFFile_008671c8;
  if (this->Presets != (SFPreset *)0x0) {
    operator_delete__(this->Presets);
  }
  if (this->PresetBags != (SFBag *)0x0) {
    operator_delete__(this->PresetBags);
  }
  if (this->PresetGenerators != (SFGenList *)0x0) {
    operator_delete__(this->PresetGenerators);
  }
  if (this->Instruments != (SFInst *)0x0) {
    operator_delete__(this->Instruments);
  }
  if (this->InstrBags != (SFBag *)0x0) {
    operator_delete__(this->InstrBags);
  }
  if (this->InstrGenerators != (SFGenList *)0x0) {
    operator_delete__(this->InstrGenerators);
  }
  pSVar3 = this->Samples;
  if (pSVar3 != (SFSample *)0x0) {
    iVar2 = this->NumSamples;
    if (0 < iVar2) {
      lVar4 = 0;
      lVar5 = 0;
      do {
        pvVar1 = *(void **)(this->Samples->Name + lVar4 + -0x22);
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
          iVar2 = this->NumSamples;
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar5 < iVar2);
      pSVar3 = this->Samples;
      if (pSVar3 == (SFSample *)0x0) goto LAB_00353342;
    }
    operator_delete__(pSVar3);
  }
LAB_00353342:
  TArray<SFPerc,_SFPerc>::~TArray(&this->Percussion);
  Timidity::FontFile::~FontFile(&this->super_FontFile);
  return;
}

Assistant:

SFFile::~SFFile()
{
	if (Presets != NULL)
	{
		delete[] Presets;
	}
	if (PresetBags != NULL)
	{
		delete[] PresetBags;
	}
	if (PresetGenerators != NULL)
	{
		delete[] PresetGenerators;
	}
	if (Instruments != NULL)
	{
		delete[] Instruments;
	}
	if (InstrBags != NULL)
	{
		delete[] InstrBags;
	}
	if (InstrGenerators != NULL)
	{
		delete[] InstrGenerators;
	}
	if (Samples != NULL)
	{
		for (int i = 0; i < NumSamples; ++i)
		{
			if (Samples[i].InMemoryData != NULL)
			{
				delete[] Samples[i].InMemoryData;
			}
		}
		delete[] Samples;
	}
}